

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_begin_phase(char *name)

{
  Caliper c;
  cali_variant_t local_40;
  Caliper local_30;
  
  cali::Caliper::Caliper(&local_30);
  local_40 = cali_make_variant_from_string(name);
  cali::Caliper::begin(&local_30,(Attribute *)&cali::phase_attr,(Variant *)&local_40);
  return;
}

Assistant:

void cali_begin_phase(const char* name)
{
    Caliper c;
    c.begin(cali::phase_attr, Variant(name));
}